

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

cmCMakePath * __thiscall
cmCMakePath::Assign<std::__cxx11::string,cmCMakePath&>
          (cmCMakePath *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source_local;
  cmCMakePath *this_local;
  
  std::filesystem::__cxx11::path::operator=(&this->Path,source);
  return this;
}

Assistant:

cmCMakePath& Assign(Source&& source)
  {
    this->Path = std::forward<Source>(source);
    return *this;
  }